

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

void gf2Inv(word *b,word *a,qr_o *f,void *stack)

{
  size_t sVar1;
  word *in_RCX;
  qr_o *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *c;
  
  sVar1 = gf2Deg(in_RDX);
  if ((sVar1 & 0x3f) == 0) {
    ppInvMod(c,in_RDI,in_RSI,(size_t)in_RDX,in_RCX + in_RDX->n + 1);
    wwCopy(in_RDI,in_RCX,in_RDX->n);
  }
  else {
    ppInvMod(c,in_RDI,in_RSI,(size_t)in_RDX,in_RCX);
  }
  return;
}

Assistant:

static void gf2Inv(word b[], const word a[], const qr_o* f, void* stack)
{
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	if (gf2Deg(f) % B_PER_W == 0)
	{
		word* c = (word*)stack;
		stack = c + f->n + 1;
		ppInvMod(c, a, f->mod, f->n + 1, stack);
		ASSERT(c[f->n] == 0);
		wwCopy(b, c, f->n);
	}
	else
		ppInvMod(b, a, f->mod, f->n, stack);
}